

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O0

void load_kde_icons(char *directory,char *icondir)

{
  int iVar1;
  int iVar2;
  char local_828 [8];
  char full [2048];
  dirent **entries;
  int n;
  int i;
  char *icondir_local;
  char *directory_local;
  
  full[0x7f8] = '\0';
  full[0x7f9] = '\0';
  full[0x7fa] = '\0';
  full[0x7fb] = '\0';
  full[0x7fc] = '\0';
  full[0x7fd] = '\0';
  full[0x7fe] = '\0';
  full[0x7ff] = '\0';
  iVar1 = fl_filename_list(directory,(dirent ***)(full + 0x7f8),fl_numericsort);
  for (entries._4_4_ = 0; entries._4_4_ < iVar1; entries._4_4_ = entries._4_4_ + 1) {
    if (*(char *)(*(long *)(full._2040_8_ + (long)entries._4_4_ * 8) + 0x13) != '.') {
      snprintf(local_828,0x800,"%s/%s",directory,
               *(long *)(full._2040_8_ + (long)entries._4_4_ * 8) + 0x13);
      iVar2 = fl_filename_isdir(local_828);
      if (iVar2 == 0) {
        load_kde_mimelnk(local_828,icondir);
      }
      else {
        load_kde_icons(local_828,icondir);
      }
    }
    free(*(void **)(full._2040_8_ + (long)entries._4_4_ * 8));
  }
  free((void *)full._2040_8_);
  return;
}

Assistant:

static void
load_kde_icons(const char *directory,	// I - Directory to load
               const char *icondir) {	// I - Location of icons
  int		i;			// Looping var
  int		n;			// Number of entries in directory
  dirent	**entries;		// Entries in directory
  char		full[FL_PATH_MAX];	// Full name of file


  entries = (dirent **)0;
  n       = fl_filename_list(directory, &entries);

  for (i = 0; i < n; i ++) {
    if (entries[i]->d_name[0] != '.') {
      snprintf(full, sizeof(full), "%s/%s", directory, entries[i]->d_name);

      if (fl_filename_isdir(full)) load_kde_icons(full, icondir);
      else load_kde_mimelnk(full, icondir);
    }

    free((void *)entries[i]);
  }

  free((void*)entries);
}